

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void drawImage1(Array2D<Imf_3_2::Rgba> *px,int w,int h)

{
  Rgba *pRVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  float lm;
  
  lVar3 = 0;
  uVar10 = 0;
  if (0 < w) {
    uVar10 = (ulong)(uint)w;
  }
  uVar2 = 0;
  if (0 < h) {
    uVar2 = (ulong)(uint)h;
  }
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    for (lVar4 = 0; uVar10 * 8 != lVar4; lVar4 = lVar4 + 8) {
      lVar6 = px->_sizeY * lVar3;
      pRVar1 = px->_data;
      Imath_3_2::half::operator=((half *)((long)&(pRVar1->r)._h + lVar4 + lVar6),0.0);
      Imath_3_2::half::operator=((half *)((long)&(pRVar1->g)._h + lVar4 + lVar6),0.0);
      Imath_3_2::half::operator=((half *)((long)&(pRVar1->b)._h + lVar4 + lVar6),0.0);
      Imath_3_2::half::operator=((half *)((long)&(pRVar1->a)._h + lVar4 + lVar6),0.0);
    }
    lVar3 = lVar3 + 8;
  }
  fVar11 = (float)w;
  fVar12 = (float)(w / 2);
  fVar13 = (float)h;
  fVar14 = (float)(h / 2);
  iVar5 = 0;
  iVar7 = 1;
  uVar9 = 0;
  while( true ) {
    if (iVar5 == 0x2bc0) break;
    dVar17 = (double)(((float)iVar5 * 3.1415927) / 5600.0);
    dVar18 = sin(dVar17 + dVar17);
    dVar19 = sin(dVar17 * 15.0);
    fVar15 = (float)(dVar19 * 0.2 + dVar18);
    dVar18 = cos(dVar17 * 3.0);
    dVar19 = cos(dVar17 * 15.0);
    fVar16 = (float)(dVar19 * 0.2 + dVar18);
    dVar18 = (double)fVar15;
    dVar19 = (double)((float)iVar7 / 5600.0);
    dVar20 = dVar19 * 0.3;
    dVar17 = dVar17 * 80.0;
    dVar21 = sin(dVar17);
    dVar22 = (double)fVar16;
    dVar23 = cos(dVar17);
    dVar24 = sin(dVar17 + 1.5707963267948966);
    dVar17 = cos(dVar17 + 1.5707963267948966);
    if ((short)((short)((ulong)uVar9 / 10) * 0x14) == (short)iVar5) {
      lm = (float)(dVar19 * 0.5 * dVar19);
      anon_unknown.dwarf_10e1::sp
                (px,w,h,(fVar15 * fVar11) / 3.0 + fVar12,(fVar16 * fVar13) / 3.0 + fVar14,
                 (float)((double)w * 0.05 * dVar19),2.0,0.8,0.1,lm);
    }
    else {
      lm = (float)(dVar19 * 0.5 * dVar19);
    }
    fVar15 = (float)(dVar19 * (double)w * 0.01);
    anon_unknown.dwarf_10e1::sp
              (px,w,h,((float)(dVar21 * dVar20 + dVar18) * fVar11) / 3.0 + fVar12,
               ((float)(dVar23 * dVar20 + dVar22) * fVar13) / 3.0 + fVar14,fVar15,0.7,0.2,2.0,lm);
    anon_unknown.dwarf_10e1::sp
              (px,w,h,((float)(dVar24 * dVar20 + dVar18) * fVar11) / 3.0 + fVar12,
               ((float)(dVar17 * dVar20 + dVar22) * fVar13) / 3.0 + fVar14,fVar15,0.2,1.5,0.1,lm);
    iVar5 = iVar5 + 2;
    iVar7 = iVar7 + 1;
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void
drawImage1 (Array2D<Rgba>& px, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = px[y][x];
            p.r     = 0;
            p.g     = 0;
            p.b     = 0;
            p.a     = 0;
        }
    }

    int n = 5600;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 2.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float r  = float (i + 1) / float (n);
        float xq = xp + 0.3 * r * sin (t * 80.0);
        float yq = yp + 0.3 * r * cos (t * 80.0);
        float xr = xp + 0.3 * r * sin (t * 80.0 + M_PI / 2);
        float yr = yp + 0.3 * r * cos (t * 80.0 + M_PI / 2);

        if (i % 10 == 0)
            sp (px,
                w,
                h,
                xp * w / 3 + w / 2,
                yp * h / 3 + h / 2,
                w * 0.05 * r,
                2.0,
                0.8,
                0.1,
                0.5 * r * r);

        sp (px,
            w,
            h,
            xq * w / 3 + w / 2,
            yq * h / 3 + h / 2,
            w * 0.01 * r,
            0.7,
            0.2,
            2.0,
            0.5 * r * r);

        sp (px,
            w,
            h,
            xr * w / 3 + w / 2,
            yr * h / 3 + h / 2,
            w * 0.01 * r,
            0.2,
            1.5,
            0.1,
            0.5 * r * r);
    }
}